

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

void do_mem_zpa(DisasContext_conflict1 *s,int zt,int pg,TCGv_i64 addr,int dtype,
               gen_helper_gvec_mem *fn)

{
  TCGContext_conflict1 *tcg_ctx;
  uint32_t val;
  TCGv_i32 pTVar1;
  TCGTemp *ts;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  val = simd_desc_aarch64(s->sve_len,s->sve_len,
                          (dtype_mop[dtype] | s->be_data) << 4 | s->mmu_idx & 0xf | zt << 8);
  pTVar1 = tcg_const_i32_aarch64(tcg_ctx,val);
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),(TCGv_i64)tcg_ctx->cpu_env,
             (long)(pg * 0x20 + 0x2c10));
  (*fn)(tcg_ctx,tcg_ctx->cpu_env,(TCGv_ptr)((long)ts - (long)tcg_ctx),addr,pTVar1);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_mem_zpa(DisasContext *s, int zt, int pg, TCGv_i64 addr,
                       int dtype, gen_helper_gvec_mem *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr t_pg;
    TCGv_i32 t_desc;
    int desc;

    /* For e.g. LD4, there are not enough arguments to pass all 4
     * registers as pointers, so encode the regno into the data field.
     * For consistency, do this even for LD1.
     */
    desc = sve_memopidx(s, dtype);
    desc |= zt << MEMOPIDX_SHIFT;
    desc = simd_desc(vsz, vsz, desc);
    t_desc = tcg_const_i32(tcg_ctx, desc);
    t_pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, pg));
    fn(tcg_ctx, tcg_ctx->cpu_env, t_pg, addr, t_desc);

    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_i32(tcg_ctx, t_desc);
}